

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialAnalyzerSettings.cpp
# Opt level: O0

void __thiscall SerialAnalyzerSettings::LoadSettings(SerialAnalyzerSettings *this,char *settings)

{
  byte bVar1;
  int iVar2;
  Mode local_40;
  bool local_39;
  Mode mode;
  bool use_autobaud;
  char *name_string;
  SimpleArchive local_20 [8];
  SimpleArchive text_archive;
  char *settings_local;
  SerialAnalyzerSettings *this_local;
  
  _text_archive = settings;
  SimpleArchive::SimpleArchive(local_20);
  SimpleArchive::SetString((char *)local_20);
  SimpleArchive::operator>>(local_20,(char **)&mode);
  iVar2 = strcmp(_mode,"SaleaeAsyncSerialAnalyzer");
  if (iVar2 != 0) {
    AnalyzerHelpers::Assert
              (
              "SaleaeAsyncSerialAnalyzer: Provided with a settings string that doesn\'t belong to us;"
              );
  }
  SimpleArchive::operator>>(local_20,&this->mInputChannel);
  SimpleArchive::operator>>(local_20,&this->mBitRate);
  SimpleArchive::operator>>(local_20,&this->mBitsPerTransfer);
  SimpleArchive::operator>>(local_20,&this->mStopBits);
  SimpleArchive::operator>>(local_20,&this->mParity);
  SimpleArchive::operator>>(local_20,&this->mShiftOrder);
  SimpleArchive::operator>>(local_20,&this->mInverted);
  bVar1 = SimpleArchive::operator>>(local_20,&local_39);
  if ((bVar1 & 1) != 0) {
    this->mUseAutobaud = (bool)(local_39 & 1);
  }
  bVar1 = SimpleArchive::operator>>(local_20,&local_40);
  if ((bVar1 & 1) != 0) {
    this->mSerialMode = local_40;
  }
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_20);
  return;
}

Assistant:

void SerialAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    const char* name_string; // the first thing in the archive is the name of the protocol analyzer that the data belongs to.
    text_archive >> &name_string;
    if( strcmp( name_string, "SaleaeAsyncSerialAnalyzer" ) != 0 )
        AnalyzerHelpers::Assert( "SaleaeAsyncSerialAnalyzer: Provided with a settings string that doesn't belong to us;" );

    text_archive >> mInputChannel;
    text_archive >> mBitRate;
    text_archive >> mBitsPerTransfer;
    text_archive >> mStopBits;
    text_archive >> *( U32* )&mParity;
    text_archive >> *( U32* )&mShiftOrder;
    text_archive >> mInverted;

    // check to make sure loading it actually works before assigning the result
    // do this when adding settings to an analyzer which has been previously released.
    bool use_autobaud;
    if( text_archive >> use_autobaud )
        mUseAutobaud = use_autobaud;

    SerialAnalyzerEnums::Mode mode;
    if( text_archive >> *( U32* )&mode )
        mSerialMode = mode;

    ClearChannels();
    AddChannel( mInputChannel, "Serial", true );

    UpdateInterfacesFromSettings();
}